

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::Transform(ON_RevSurface *this,ON_Xform *xform)

{
  ON_Line *this_00;
  ON_Curve *pOVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  ON_3dVector transX;
  ON_3dVector transZ;
  ON_3dVector X;
  ON_3dVector transXxY;
  ON_3dVector transY;
  ON_BoundingBox local_120;
  ON_3dVector local_f0;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  int iVar5;
  
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  ON_Object::TransformUserData((ON_Object *)this,xform);
  pOVar1 = this->m_curve;
  if (pOVar1 == (ON_Curve *)0x0) {
    bVar3 = 0;
  }
  else {
    iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar1,xform);
    bVar3 = (byte)iVar5;
  }
  this_00 = &this->m_axis;
  ON_Line::Tangent(&local_d8,this_00);
  ON_3dVector::PerpendicularTo(&local_a8,&local_d8);
  ON_3dVector::Unitize(&local_a8);
  ON_CrossProduct(&local_c0,&local_d8,&local_a8);
  bVar4 = ON_Line::Transform(this_00,xform);
  ON_Line::Tangent(&local_f0,this_00);
  dVar2 = ON_3dVector::Length(&local_f0);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    ON_Xform::operator*((ON_3dVector *)&local_120,xform,&local_a8);
    ON_Xform::operator*(&local_48,xform,&local_c0);
    ON_CrossProduct(&local_60,(ON_3dVector *)&local_120,&local_48);
    dVar2 = ON_3dVector::operator*(&local_60,&local_f0);
    if (0.0 <= dVar2) goto LAB_0059de2d;
    ON_Line::Direction(&local_90,this_00);
    ON_3dPoint::operator-(&local_78,&this_00->from,&local_90);
    (this->m_axis).to.z = local_78.z;
  }
  else {
    ON_3dPoint::operator+(&local_120.m_min,&this_00->from,&local_d8);
    (this->m_axis).to.z = local_120.m_min.z;
    local_78.x._0_4_ = local_120.m_min.x._0_4_;
    local_78.x._4_4_ = local_120.m_min.x._4_4_;
    local_78.y._0_4_ = local_120.m_min.y._0_4_;
    local_78.y._4_4_ = local_120.m_min.y._4_4_;
  }
  *(undefined4 *)&(this->m_axis).to.x = local_78.x._0_4_;
  *(undefined4 *)((long)&(this->m_axis).to.x + 4) = local_78.x._4_4_;
  *(undefined4 *)&(this->m_axis).to.y = local_78.y._0_4_;
  *(undefined4 *)((long)&(this->m_axis).to.y + 4) = local_78.y._4_4_;
LAB_0059de2d:
  ON_BoundingBox::Destroy(&this->m_bbox);
  ON_Geometry::BoundingBox(&local_120,(ON_Geometry *)this);
  (this->m_bbox).m_max.y = local_120.m_max.y;
  (this->m_bbox).m_max.z = local_120.m_max.z;
  (this->m_bbox).m_min.z = local_120.m_min.z;
  (this->m_bbox).m_max.x = local_120.m_max.x;
  (this->m_bbox).m_min.x = (double)CONCAT44(local_120.m_min.x._4_4_,local_120.m_min.x._0_4_);
  (this->m_bbox).m_min.y = (double)CONCAT44(local_120.m_min.y._4_4_,local_120.m_min.y._0_4_);
  return (bool)(bVar3 & bVar4);
}

Assistant:

bool ON_RevSurface::Transform( const ON_Xform& xform )
{
  DestroyRuntimeCache();
  TransformUserData(xform);
  bool rc = (m_curve) ? m_curve->Transform(xform) : false;
  ON_3dVector X, Y, Z;
  Z = m_axis.Tangent();
  X.PerpendicularTo( Z );
  X.Unitize();
  Y = ON_CrossProduct( Z, X );
  if ( !m_axis.Transform(xform) )
    rc = false;
  ON_3dVector transZ = m_axis.Tangent();

  if ( transZ.Length() == 0.0 )
  {
    // transformation collapsed axis
    m_axis.to = m_axis.from + Z;
  }
  else
  {
    // see if axis needs to be reversed.
    // (Happens with transformations that
    // have negative determinant - like mirroring.)
    ON_3dVector transX = xform*X;
    ON_3dVector transY = xform*Y;
    ON_3dVector transXxY = ON_CrossProduct( transX, transY );
    double d = transXxY*transZ;
    if ( d < 0.0 )
      m_axis.to = m_axis.from - m_axis.Direction();
  }

  m_bbox.Destroy();
  m_bbox = BoundingBox();
  return rc;
}